

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_opengl_info.h
# Opt level: O2

void print_opengl_info(GLFWwindow *window)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  GLubyte *pGVar4;
  
  uVar1 = glfwGetWindowAttrib(window,0x22002);
  uVar2 = glfwGetWindowAttrib(window,0x22003);
  uVar3 = glfwGetWindowAttrib(window,0x22004);
  printf("OpenGL version recieved: %d.%d.%d\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3);
  pGVar4 = (*glad_glGetString)(0x1f02);
  printf("Supported OpenGL is %s\n",pGVar4);
  pGVar4 = (*glad_glGetString)(0x8b8c);
  printf("Supported GLSL is %s\n",pGVar4);
  return;
}

Assistant:

void print_opengl_info(GLFWwindow * window)
{
  int major, minor, rev;
  major = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MAJOR);
  minor = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MINOR);
  rev = glfwGetWindowAttrib(window, GLFW_CONTEXT_REVISION);
  printf("OpenGL version recieved: %d.%d.%d\n", major, minor, rev);
  printf("Supported OpenGL is %s\n", (const char*)glGetString(GL_VERSION));
  printf("Supported GLSL is %s\n", (const char*)glGetString(GL_SHADING_LANGUAGE_VERSION));
}